

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.cxx
# Opt level: O1

void __thiscall
cmLinkItemGraphVisitor::VisitLinks
          (cmLinkItemGraphVisitor *this,cmLinkItem *item,cmLinkItem *rootItem,string *config)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *item_00;
  size_t __n;
  bool bVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  DependencyMap dependencies;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  GetDependencies(item->Target,config,(DependencyMap *)&local_60);
  for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    item_00 = &p_Var6[2]._M_parent;
    VisitItem(this,(cmLinkItem *)item_00);
    bVar2 = LinkVisited(this,item,(cmLinkItem *)item_00);
    if (!bVar2) {
      (*this->_vptr_cmLinkItemGraphVisitor[4])(this,item,item_00,(ulong)p_Var6[2]._M_color);
      psVar4 = cmLinkItem::AsStr_abi_cxx11_(rootItem);
      psVar5 = cmLinkItem::AsStr_abi_cxx11_(item);
      __n = psVar4->_M_string_length;
      if ((__n != psVar5->_M_string_length) ||
         ((__n != 0 &&
          (iVar3 = bcmp((psVar4->_M_dataplus)._M_p,(psVar5->_M_dataplus)._M_p,__n), iVar3 != 0)))) {
        (*this->_vptr_cmLinkItemGraphVisitor[5])(this,rootItem,item_00);
      }
      VisitLinks(this,(cmLinkItem *)item_00,(cmLinkItem *)item_00);
      VisitLinks(this,(cmLinkItem *)item_00,item);
      VisitLinks(this,(cmLinkItem *)item_00,rootItem);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLinkItemGraphVisitor::VisitLinks(cmLinkItem const& item,
                                        cmLinkItem const& rootItem,
                                        std::string const& config)
{
  auto const& target = *item.Target;

  DependencyMap dependencies;
  cmLinkItemGraphVisitor::GetDependencies(target, config, dependencies);

  for (auto const& d : dependencies) {
    auto const& dependency = d.second;
    auto const& dependencyType = dependency.first;
    auto const& dependee = dependency.second;
    this->VisitItem(dependee);

    if (this->LinkVisited(item, dependee)) {
      continue;
    }

    this->OnDirectLink(item, dependee, dependencyType);

    if (rootItem.AsStr() != item.AsStr()) {
      this->OnIndirectLink(rootItem, dependee);
    }

    // Visit all the direct and indirect links.
    this->VisitLinks(dependee, dependee);
    this->VisitLinks(dependee, item);
    this->VisitLinks(dependee, rootItem);
  }
}